

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O2

void __thiscall EfcFlash::writeOptions(EfcFlash *this)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  const_reference cVar4;
  int iVar5;
  uint uVar6;
  ulong __n;
  reference rVar7;
  vector<bool,_std::allocator<bool>_> current;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  iVar5 = (*(this->super_Flash)._vptr_Flash[0x16])();
  if (((char)iVar5 != '\0') && ((this->super_Flash)._bootFlash._dirty == true)) {
    bVar1 = (this->super_Flash)._bootFlash._value;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0x14])(this);
    if (bVar1 != (bool)(char)iVar5) {
      waitFSR(this,1);
      writeFCR0(this,((this->super_Flash)._bootFlash._value ^ 1U) * '\x02' + '\v',2);
    }
  }
  iVar5 = (*(this->super_Flash)._vptr_Flash[0x13])(this);
  if (((char)iVar5 != '\0') && ((this->super_Flash)._bor._dirty == true)) {
    bVar1 = (this->super_Flash)._bor._value;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0x11])(this);
    if (bVar1 != (bool)(char)iVar5) {
      waitFSR(this,1);
      writeFCR0(this,((this->super_Flash)._bor._value ^ 1U) * '\x02' + '\v',1);
    }
  }
  iVar5 = (*(this->super_Flash)._vptr_Flash[0x10])(this);
  if (((char)iVar5 != '\0') && ((this->super_Flash)._bod._dirty == true)) {
    bVar1 = (this->super_Flash)._bod._value;
    iVar5 = (*(this->super_Flash)._vptr_Flash[0xe])(this);
    if (bVar1 != (bool)(char)iVar5) {
      waitFSR(this,1);
      writeFCR0(this,((this->super_Flash)._bod._value ^ 1U) * '\x02' + '\v',0);
    }
  }
  if ((this->super_Flash)._regions._dirty == true) {
    current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    current.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    (*(this->super_Flash)._vptr_Flash[10])(&local_58,this);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (&current,(vector<bool,_std::allocator<bool>_> *)&local_58);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    this_00 = &(this->super_Flash)._regions._value;
    for (uVar6 = 0; __n = (ulong)uVar6,
        __n < (ulong)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this->super_Flash)._regions._value.super__Bvector_base<std::allocator<bool>_>.
                    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        uVar6 = uVar6 + 1) {
      cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&current,__n);
      if (cVar4 != ((*rVar7._M_p & rVar7._M_mask) != 0)) {
        uVar2 = (this->super_Flash)._lockRegions;
        if (((this->super_Flash)._planes == 2) && (uVar2 >> 1 <= uVar6)) {
          uVar3 = (this->super_Flash)._pages;
          waitFSR(this,1);
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
          writeFCR1(this,!cVar4 * '\x02' + '\x02',((uVar6 - (uVar2 >> 1)) * uVar3) / uVar2);
        }
        else {
          uVar3 = (this->super_Flash)._pages;
          waitFSR(this,1);
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
          writeFCR0(this,!cVar4 * '\x02' + '\x02',(uVar3 * uVar6) / uVar2);
        }
      }
    }
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&current.super__Bvector_base<std::allocator<bool>_>);
  }
  if (((this->super_Flash)._security._dirty == true) &&
     ((this->super_Flash)._security._value == true)) {
    iVar5 = (*(this->super_Flash)._vptr_Flash[0xc])(this);
    if ((char)iVar5 != '\x01') {
      waitFSR(this,1);
      writeFCR0(this,'\x0f',0);
    }
  }
  return;
}

Assistant:

void
EfcFlash::writeOptions()
{
    if (canBootFlash() && _bootFlash.isDirty() && _bootFlash.get() != getBootFlash())
    {
        waitFSR();
        writeFCR0(_bootFlash.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 2);
    }
    if (canBor() && _bor.isDirty() && _bor.get() != getBor())
    {
        waitFSR();
        writeFCR0(_bor.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 1);
    }
    if (canBod() && _bod.isDirty() && _bod.get() != getBod())
    {
        waitFSR();
        writeFCR0(_bod.get() ? EFC_FCMD_SGPB : EFC_FCMD_CGPB, 0);
    }
    if (_regions.isDirty())
    {
        uint32_t page;
        std::vector<bool> current;

        current = getLockRegions();

        for (uint32_t region = 0; region < _regions.get().size(); region++)
        {
            if (_regions.get()[region] != current[region])
            {
                if (_planes == 2 && region >= _lockRegions / 2)
                {
                    page = (region - _lockRegions / 2) * _pages / _lockRegions;
                    waitFSR();
                    writeFCR1(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
                else
                {
                    page = region * _pages / _lockRegions;
                    waitFSR();
                    writeFCR0(_regions.get()[region] ? EFC_FCMD_SLB : EFC_FCMD_CLB, page);
                }
            }
        }
    }
    if (_security.isDirty() && _security.get() == true && _security.get() != getSecurity())
    {
        waitFSR();
        writeFCR0(EFC_FCMD_SSB, 0);
    }
}